

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::Clone
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZGeoMesh *DestMesh)

{
  TPZGeoMesh *pTVar1;
  TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this_00;
  
  pTVar1 = (this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>).super_TPZGeoEl.
           fMesh;
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *)operator_new(0xbc0);
  if (pTVar1 == DestMesh) {
    TPZGeoElRefPattern(this_00,this);
  }
  else {
    TPZGeoElRefPattern(this_00,DestMesh,this);
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::Clone(TPZGeoMesh &DestMesh) const{
    if(&DestMesh == this->Mesh())
    {
        return new TPZGeoElRefPattern<TGeo>(*this);
    }
    else
    {
        return new TPZGeoElRefPattern<TGeo>(DestMesh, *this);
    }
}